

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLog.cpp
# Opt level: O3

ssize_t __thiscall SocketLog::send(SocketLog *this,int __fd,void *__buf,size_t __n,int __flags)

{
  pointer __src;
  TCPStream *this_00;
  bool bVar1;
  int iVar2;
  ssize_t sVar3;
  undefined4 extraout_var;
  pointer ppTVar4;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  const_iterator iter;
  pointer __dest;
  
  pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT44(in_register_00000034,__fd);
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->streamMutex);
  if (iVar2 == 0) {
    if (((((this->sendInterceptor).super__Function_base._M_manager == (_Manager_type)0x0) ||
         (bVar1 = (*(this->sendInterceptor)._M_invoker)((_Any_data *)&this->sendInterceptor,pbVar5),
         !bVar1)) && (this->inited == true)) &&
       (__dest = (this->connectedStreams).
                 super__Vector_base<TCPStream_*,_std::allocator<TCPStream_*>_>._M_impl.
                 super__Vector_impl_data._M_start,
       __dest != (this->connectedStreams).
                 super__Vector_base<TCPStream_*,_std::allocator<TCPStream_*>_>._M_impl.
                 super__Vector_impl_data._M_finish)) {
      do {
        sVar3 = TCPStream::send(*__dest,(int)(pbVar5->_M_dataplus)._M_p,
                                (void *)pbVar5->_M_string_length,__n,__flags);
        if (sVar3 == -1) {
          printf("send failed! delete(close) stream");
          putchar(10);
          this_00 = *__dest;
          if (this_00 != (TCPStream *)0x0) {
            TCPStream::~TCPStream(this_00);
          }
          operator_delete(this_00);
          __src = __dest + 1;
          ppTVar4 = (this->connectedStreams).
                    super__Vector_base<TCPStream_*,_std::allocator<TCPStream_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if (__src != ppTVar4) {
            memmove(__dest,__src,(long)ppTVar4 - (long)__src);
            ppTVar4 = (this->connectedStreams).
                      super__Vector_base<TCPStream_*,_std::allocator<TCPStream_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          ppTVar4 = ppTVar4 + -1;
          (this->connectedStreams).super__Vector_base<TCPStream_*,_std::allocator<TCPStream_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppTVar4;
        }
        else {
          __dest = __dest + 1;
          ppTVar4 = (this->connectedStreams).
                    super__Vector_base<TCPStream_*,_std::allocator<TCPStream_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
      } while (__dest != ppTVar4);
    }
    iVar2 = pthread_mutex_unlock((pthread_mutex_t *)&this->streamMutex);
    return CONCAT44(extraout_var,iVar2);
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void SocketLog::send(const std::string& msg) {
    std::lock_guard<std::mutex> lockStream(streamMutex);
    LOGD("SocketLog::send: %s", msg.c_str());

    if (sendInterceptor) {
        if (sendInterceptor(msg)) return;
    }

    if (!inited)
        return;

    auto size = connectedStreams.size();
    if (size == 0) {
        LOGD("no stream connected now! will not send!");
    } else {
        LOGD("stream connected num=%ld", size);
    }

    for(auto iter = connectedStreams.cbegin(); iter != connectedStreams.cend();) {
        auto& stream = *iter;

        LOGD("try to send to stream:%p", stream);
        auto ret = stream->send(msg.data(), msg.length());
        if (ret == -1) {
            LOGE("send failed! delete(close) stream");
            delete stream;
            iter = connectedStreams.erase(iter);
        } else {
            LOGD("send success!");
            iter++;
        }
    }
}